

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O2

Player * __thiscall Gameplay::checkWinningCondition(Gameplay *this)

{
  int iVar1;
  Gameplay *pGVar2;
  ostream *poVar3;
  Stronghold *this_00;
  string *psVar4;
  Player *pPVar5;
  
  pGVar2 = this;
  while( true ) {
    pGVar2 = (Gameplay *)
             (pGVar2->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
             super__List_node_base._M_next;
    (this->it)._M_node = (_List_node_base *)pGVar2;
    if (pGVar2 == this) break;
    iVar1 = Player::getNumberOfProvinces
                      ((Player *)
                       &(pGVar2->players).super__List_base<Player,_std::allocator<Player>_>._M_impl.
                        _M_node._M_size);
    if (iVar1 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Player ");
      this_00 = Player::getStronghold((Player *)((this->it)._M_node + 1));
      psVar4 = BlackCard::getName_abi_cxx11_(&this_00->super_BlackCard);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"lost.");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::list<Player,_std::allocator<Player>_>::remove
                (&this->players,(char *)((this->it)._M_node + 1));
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar3 = std::operator<<(poVar3,"players remaining.");
      std::endl<char,std::char_traits<char>>(poVar3);
      pGVar2 = (Gameplay *)
               (this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
               super__List_node_base._M_next;
      (this->it)._M_node = (_List_node_base *)pGVar2;
    }
    else {
      pGVar2 = (Gameplay *)(this->it)._M_node;
    }
  }
  pPVar5 = (Player *)0x0;
  if ((this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node._M_size == 1
     ) {
    pPVar5 = (Player *)
             ((this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
              super__List_node_base._M_next + 1);
  }
  return pPVar5;
}

Assistant:

Player *Gameplay::checkWinningCondition()                       //if someone won returns a pointer to that player else returns null
{                                                               //prints if someone lost and removes him from the list
    for (it=players.begin(); it!=players.end(); it++)
    {
        if (!it->getNumberOfProvinces())
        {
            cout << "Player "<<it->getStronghold()->getName()<<"lost." << endl;

            players.remove(*it);
            cout << players.size() <<"players remaining." << endl;

            it=players.begin();
        }
    }
    if (players.size() == 1)
        return &*players.begin();

    return nullptr;
}